

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformations.c
# Opt level: O0

void al_perspective_transform
               (ALLEGRO_TRANSFORM *trans,float left,float top,float n,float right,float bottom,
               float f)

{
  float in_XMM0_Da;
  float fVar1;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  float in_XMM4_Da;
  float in_XMM5_Da;
  ALLEGRO_TRANSFORM tmp;
  float delta_z;
  float delta_y;
  float delta_x;
  float local_6c;
  float local_58;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float in_stack_ffffffffffffffc8;
  
  fVar1 = in_XMM5_Da - in_XMM2_Da;
  al_identity_transform((ALLEGRO_TRANSFORM *)&local_6c);
  local_6c = (in_XMM2_Da * 2.0) / (in_XMM3_Da - in_XMM0_Da);
  local_58 = (in_XMM2_Da * 2.0) / (in_XMM1_Da - in_XMM4_Da);
  local_4c = (in_XMM3_Da + in_XMM0_Da) / (in_XMM3_Da - in_XMM0_Da);
  local_48 = (in_XMM1_Da + in_XMM4_Da) / (in_XMM1_Da - in_XMM4_Da);
  local_44 = -(in_XMM5_Da + in_XMM2_Da) / fVar1;
  local_40 = -1.0;
  al_compose_transform
            ((ALLEGRO_TRANSFORM *)((ulong)(uint)fVar1 << 0x20),
             (ALLEGRO_TRANSFORM *)
             CONCAT44((in_XMM5_Da * -2.0 * in_XMM2_Da) / fVar1,in_stack_ffffffffffffffc8));
  return;
}

Assistant:

void al_perspective_transform(ALLEGRO_TRANSFORM *trans,
   float left, float top, float n,
   float right, float bottom, float f)
{
   float delta_x = right - left;
   float delta_y = top - bottom;
   float delta_z = f - n;
   ALLEGRO_TRANSFORM tmp;

   al_identity_transform(&tmp);

   tmp.m[0][0] = 2.0f * n / delta_x;
   tmp.m[1][1] = 2.0f * n / delta_y;
   tmp.m[2][0] = (right + left) / delta_x;
   tmp.m[2][1] = (top + bottom) / delta_y;
   tmp.m[2][2] = -(f + n) / delta_z;
   tmp.m[2][3] = -1.0f;
   tmp.m[3][2] = -2.0f * f * n / delta_z;
   tmp.m[3][3] = 0;

   al_compose_transform(trans, &tmp);
}